

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O1

void __thiscall mognetwork::Selector::setFds(Selector *this)

{
  __fd_mask *p_Var1;
  int iVar2;
  _List_node_base *p_Var3;
  int iVar4;
  int iVar5;
  
  this->m_maxFds = 0;
  (this->m_rdfs).fds_bits[0] = 0;
  (this->m_rdfs).fds_bits[1] = 0;
  (this->m_rdfs).fds_bits[2] = 0;
  (this->m_rdfs).fds_bits[3] = 0;
  (this->m_rdfs).fds_bits[4] = 0;
  (this->m_rdfs).fds_bits[5] = 0;
  (this->m_rdfs).fds_bits[6] = 0;
  (this->m_rdfs).fds_bits[7] = 0;
  (this->m_rdfs).fds_bits[8] = 0;
  (this->m_rdfs).fds_bits[9] = 0;
  (this->m_rdfs).fds_bits[10] = 0;
  (this->m_rdfs).fds_bits[0xb] = 0;
  (this->m_rdfs).fds_bits[0xc] = 0;
  (this->m_rdfs).fds_bits[0xd] = 0;
  (this->m_rdfs).fds_bits[0xe] = 0;
  (this->m_rdfs).fds_bits[0xf] = 0;
  (this->m_wdfs).fds_bits[0] = 0;
  (this->m_wdfs).fds_bits[1] = 0;
  (this->m_wdfs).fds_bits[2] = 0;
  (this->m_wdfs).fds_bits[3] = 0;
  (this->m_wdfs).fds_bits[4] = 0;
  (this->m_wdfs).fds_bits[5] = 0;
  (this->m_wdfs).fds_bits[6] = 0;
  (this->m_wdfs).fds_bits[7] = 0;
  (this->m_wdfs).fds_bits[8] = 0;
  (this->m_wdfs).fds_bits[9] = 0;
  (this->m_wdfs).fds_bits[10] = 0;
  (this->m_wdfs).fds_bits[0xb] = 0;
  (this->m_wdfs).fds_bits[0xc] = 0;
  (this->m_wdfs).fds_bits[0xd] = 0;
  (this->m_wdfs).fds_bits[0xe] = 0;
  (this->m_wdfs).fds_bits[0xf] = 0;
  p_Var3 = (this->m_readSockets).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var3 != (_List_node_base *)&this->m_readSockets) {
    iVar4 = this->m_maxFds;
    do {
      iVar2 = *(int *)&p_Var3[1]._M_next;
      iVar5 = iVar2 + 0x3f;
      if (-1 < iVar2) {
        iVar5 = iVar2;
      }
      p_Var1 = (this->m_rdfs).fds_bits + (iVar5 >> 6);
      *p_Var1 = *p_Var1 | 1L << ((byte)iVar2 & 0x3f);
      if (iVar4 < iVar2) {
        iVar4 = *(int *)&p_Var3[1]._M_next;
      }
      this->m_maxFds = iVar4;
      p_Var3 = p_Var3->_M_next;
    } while (p_Var3 != (_List_node_base *)&this->m_readSockets);
  }
  p_Var3 = (this->m_writeSockets).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var3 != (_List_node_base *)&this->m_writeSockets) {
    iVar4 = this->m_maxFds;
    do {
      iVar2 = *(int *)&p_Var3[1]._M_next;
      iVar5 = iVar2 + 0x3f;
      if (-1 < iVar2) {
        iVar5 = iVar2;
      }
      p_Var1 = (this->m_wdfs).fds_bits + (iVar5 >> 6);
      *p_Var1 = *p_Var1 | 1L << ((byte)iVar2 & 0x3f);
      if (iVar4 < iVar2) {
        iVar4 = *(int *)&p_Var3[1]._M_next;
      }
      this->m_maxFds = iVar4;
      p_Var3 = p_Var3->_M_next;
    } while (p_Var3 != (_List_node_base *)&this->m_writeSockets);
  }
  return;
}

Assistant:

void Selector::setFds()
  {
    m_maxFds = 0;
    FD_ZERO(&m_rdfs);
    FD_ZERO(&m_wdfs);

    for (std::list<SocketFD>::iterator it = m_readSockets.begin();
	 it != m_readSockets.end(); ++it)
      {
	FD_SET(*it, &m_rdfs);
	m_maxFds = std::max(m_maxFds, *it);
      }

    for (std::list<SocketFD>::iterator it = m_writeSockets.begin();
	 it != m_writeSockets.end(); ++it)
      {
	FD_SET(*it, &m_wdfs);
	m_maxFds = std::max(m_maxFds, *it);
      }
  }